

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

bool __thiscall
wasm::analysis::Vector<wasm::analysis::Bool>::join
          (Vector<wasm::analysis::Bool> *this,Element *joinee,Element *joiner)

{
  _Bit_type *p_Var1;
  _Bit_type *p_Var2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  p_Var1 = (joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  sVar5 = (ulong)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)(joinee->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var1) *
          8;
  if (sVar5 != this->size) {
    __assert_fail("joinee.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x54,
                  "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const Element &) const [L = wasm::analysis::Bool]"
                 );
  }
  p_Var2 = (joiner->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(joiner->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset +
      ((long)(joiner->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8 != sVar5) {
    __assert_fail("joiner.size() == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/analysis/lattices/vector.h"
                  ,0x55,
                  "bool wasm::analysis::Vector<wasm::analysis::Bool>::join(Element &, const Element &) const [L = wasm::analysis::Bool]"
                 );
  }
  if (sVar5 == 0) {
    bVar3 = false;
  }
  else {
    uVar4 = 0;
    bVar3 = false;
    do {
      uVar6 = uVar4 + 0x3f;
      if (-1 < (long)uVar4) {
        uVar6 = uVar4;
      }
      lVar8 = (long)uVar6 >> 6;
      uVar6 = (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001);
      uVar7 = (uint)uVar4 & 0x3f;
      bVar9 = (p_Var2[lVar8 + uVar6 + 0xffffffffffffffff] >> uVar7 & 1) != 0;
      bVar10 = (p_Var1[lVar8 + uVar6 + 0xffffffffffffffff] >> uVar7 & 1) == 0;
      if (bVar10 && bVar9) {
        p_Var1[lVar8 + uVar6 + 0xffffffffffffffff] =
             p_Var1[lVar8 + uVar6 + 0xffffffffffffffff] | 1L << ((byte)uVar4 & 0x3f);
        sVar5 = this->size;
      }
      bVar3 = (bool)(bVar3 | (bVar10 && bVar9));
      uVar4 = uVar4 + 1;
    } while (uVar4 < sVar5);
  }
  return bVar3;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    assert(joinee.size() == size);
    assert(joiner.size() == size);
    bool result = false;
    for (size_t i = 0; i < size; ++i) {
      result |= joinAtIndex(joinee, i, joiner[i]);
    }
    return result;
  }